

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

istream * operator>>(istream *is,Graph<Node> *g)

{
  NodeList<Node> *pNVar1;
  int iVar2;
  Edge *__size;
  Node *pNVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  istream *piVar7;
  size_t __size_00;
  int iVar8;
  int cost;
  int y;
  int x;
  int inputEdgeCnt;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  istream *local_40;
  vector<Edge> *local_38;
  
  local_40 = is;
  piVar7 = (istream *)std::istream::operator>>((istream *)is,&g->_nodeCnt);
  std::istream::operator>>(piVar7,&local_44);
  Graph<Node>::resize(g,g->_nodeCnt);
  if (0 < local_44) {
    local_38 = &g->edges;
    iVar8 = 0;
    do {
      piVar7 = (istream *)std::istream::operator>>((istream *)local_40,&local_48);
      piVar7 = (istream *)std::istream::operator>>(piVar7,&local_4c);
      std::istream::operator>>(piVar7,&local_50);
      iVar6 = local_48;
      iVar5 = local_4c;
      iVar4 = local_50;
      g->_edgeCnt = g->_edgeCnt + 1;
      iVar2 = (g->edges)._capacity;
      if (iVar2 <= (g->edges)._size) {
        vector<Edge>::realloc(local_38,(void *)(ulong)(uint)(iVar2 * 2),__size_00);
      }
      iVar2 = (g->edges)._size;
      (g->edges)._size = iVar2 + 1;
      __size = (g->edges).vect;
      __size[iVar2]._nodeS = iVar6;
      __size[iVar2]._nodeD = iVar5;
      __size[iVar2]._cost = iVar4;
      pNVar1 = (g->G).vect + iVar6;
      iVar2 = (pNVar1->nodes)._capacity;
      if (iVar2 <= (pNVar1->nodes)._size) {
        vector<Node>::realloc(&pNVar1->nodes,(void *)(ulong)(uint)(iVar2 * 2),(size_t)__size);
      }
      iVar2 = (pNVar1->nodes)._size;
      (pNVar1->nodes)._size = iVar2 + 1;
      pNVar3 = (pNVar1->nodes).vect;
      pNVar3[iVar2]._index = iVar5;
      pNVar3[iVar2]._costTo = iVar4;
      pNVar1 = (g->G).vect + iVar5;
      iVar2 = (pNVar1->nodes)._capacity;
      if (iVar2 <= (pNVar1->nodes)._size) {
        vector<Node>::realloc(&pNVar1->nodes,(void *)(ulong)(uint)(iVar2 * 2),(size_t)pNVar3);
      }
      iVar2 = (pNVar1->nodes)._size;
      (pNVar1->nodes)._size = iVar2 + 1;
      pNVar3 = (pNVar1->nodes).vect;
      pNVar3[iVar2]._index = iVar6;
      pNVar3[iVar2]._costTo = iVar4;
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_44);
  }
  return local_40;
}

Assistant:

std::istream &operator >> (std::istream &is, Graph <NodeT> &g) {
        int inputEdgeCnt;
        is >> g._nodeCnt >> inputEdgeCnt;
        g.resize(g._nodeCnt);
        for (int i = 0; i < inputEdgeCnt; ++i) {
            int x, y, cost;
            is >> x >> y >> cost;
            g.addEdge(Edge(x, y, cost));
        }
        return is;
    }